

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-maxflow.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  char *__s2;
  undefined1 auVar4 [16];
  int32_t iVar5;
  uchar uVar6;
  greatest_test_res gVar7;
  flow_t fVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  uint uVar20;
  FlowNetwork net;
  MaxFlowResult result;
  MaxFlow mf;
  FlowNetwork local_a8;
  MaxFlowResult local_98;
  ulong local_80;
  MaxFlow local_78;
  ulong local_38;
  
  GREATEST_INIT();
  if (1 < argc) {
    iVar18 = 1;
    uVar6 = greatest_info.verbosity;
    bVar13 = greatest_info.flags;
    do {
      __s2 = argv[iVar18];
      if (*__s2 == '-') {
        bVar3 = __s2[1];
        switch(bVar3) {
        case 0x65:
          greatest_info.exact_name_match = '\x01';
          break;
        case 0x66:
          bVar13 = bVar13 | 1;
          greatest_info.flags = bVar13;
          break;
        case 0x67:
        case 0x69:
        case 0x6a:
        case 0x6b:
        case 0x6d:
        case 0x6e:
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x72:
        case 0x75:
        case 0x77:
switchD_00101e09_caseD_67:
          iVar18 = strncmp("--help",__s2,6);
          if (iVar18 == 0) {
switchD_00101e09_caseD_68:
            greatest_usage(*argv);
            exit(0);
          }
          uVar14 = bVar3 - 0x2d;
          if (uVar14 == 0) {
            uVar14 = (uint)(byte)__s2[2];
          }
          if (uVar14 != 0) {
            fprintf(_stdout,"Unknown argument \'%s\'\n",__s2);
LAB_001033a1:
            greatest_usage(*argv);
            exit(1);
          }
          goto LAB_00101e9e;
        case 0x68:
          goto switchD_00101e09_caseD_68;
        case 0x6c:
          bVar13 = bVar13 | 2;
          greatest_info.flags = bVar13;
          break;
        case 0x73:
        case 0x74:
        case 0x78:
          iVar16 = iVar18 + 1;
          if (argc <= iVar16) goto LAB_001033a1;
          switch(bVar3) {
          case 0x73:
            greatest_info.suite_filter = argv[iVar16];
            iVar18 = iVar16;
            break;
          case 0x74:
            greatest_info.test_filter = argv[iVar16];
            iVar18 = iVar16;
            break;
          default:
            goto switchD_00101e09_caseD_67;
          case 0x76:
            goto switchD_00101e09_caseD_76;
          case 0x78:
            greatest_info.test_exclude = argv[iVar16];
            iVar18 = iVar16;
          }
          break;
        case 0x76:
switchD_00101e09_caseD_76:
          uVar6 = uVar6 + '\x01';
          greatest_info.verbosity = uVar6;
          break;
        default:
          if (bVar3 != 0x61) goto switchD_00101e09_caseD_67;
          bVar13 = bVar13 | 4;
          greatest_info.flags = bVar13;
        }
      }
      iVar18 = iVar18 + 1;
    } while (iVar18 < argc);
  }
LAB_00101e9e:
  iVar18 = greatest_test_pre("weird_network");
  if (iVar18 == 1) {
    local_a8._0_8_ = 0;
    local_a8.caps = (flow_t *)0x0;
    local_78.payload._32_8_ = 0;
    local_78.payload.field_1.list = (int32_t *)0x0;
    local_78.payload.field_0.temp_mf.colors = (int32_t *)0x0;
    local_78.payload.field_1.curr_neigh = (int32_t *)0x0;
    local_78.payload.field_1.flows = (flow_t *)0x0;
    local_78.payload.field_1.height = (int32_t *)0x0;
    local_78.nnodes = 0;
    local_78.s = 0;
    local_78.t = 0;
    local_78.kind = MAXFLOW_ALGO_INVALID;
    local_98.nnodes = 0;
    local_98.s = 0;
    local_98.t = 0;
    local_98.maxflow = 0;
    local_98.colors = (int *)0x0;
    flow_network_create(&local_a8,4);
    max_flow_create(&local_78,4,MAXFLOW_ALGO_PUSH_RELABEL);
    max_flow_result_create(&local_98,4);
    if ((long)local_a8.nnodes < 2) goto LAB_00103e66;
    if (local_a8.nnodes == 2) goto LAB_00103e85;
    local_a8.caps[(long)local_a8.nnodes + 2] = 0x28;
    if (local_a8.nnodes < 3) goto LAB_00103e66;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 2 + 1] = 0x3c;
    if ((long)local_a8.nnodes < 2) goto LAB_00103e66;
    local_a8.caps[local_a8.nnodes] = 0x50;
    if ((long)local_a8.nnodes < 1) goto LAB_00103e66;
    if ((local_a8.nnodes == 1) || (local_a8.caps[1] = 0x28, (uint)local_a8.nnodes < 4))
    goto LAB_00103e85;
    local_a8.caps[(long)local_a8.nnodes + 3] = 0x28;
    if (local_a8.nnodes < 4) goto LAB_00103e66;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 3 + 1] = 0x14;
    if (local_a8.nnodes < 3) goto LAB_00103e66;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 2] = 0x14;
    if (local_a8.nnodes < 1) goto LAB_00103e66;
    if ((uint)local_a8.nnodes < 3) goto LAB_00103e85;
    local_a8.caps[2] = 0x14;
    if ((local_a8.nnodes == 3) ||
       (local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 3] = 0x3c, local_a8.nnodes < 1))
    goto LAB_00103e66;
    if ((uint)local_a8.nnodes < 4) goto LAB_00103e85;
    local_a8.caps[3] = 0x50;
    max_flow_single_pair(&local_a8,&local_78,1,0,&local_98);
    gVar7 = validate_with_slow_max_flow(&local_a8,1,0,&local_98);
    iVar18 = -1;
    if (gVar7 == GREATEST_TEST_RES_PASS) {
      max_flow_result_destroy(&local_98);
      max_flow_destroy(&local_78);
      flow_network_destroy(&local_a8);
      greatest_info.msg = (char *)0x0;
      iVar18 = 0;
    }
    greatest_test_post(iVar18);
  }
  iVar18 = greatest_test_pre("weird_network2");
  if (iVar18 == 1) {
    local_a8._0_8_ = 0;
    local_a8.caps = (flow_t *)0x0;
    local_78.payload._32_8_ = 0;
    local_78.payload.field_1.list = (int32_t *)0x0;
    local_78.payload.field_0.temp_mf.colors = (int32_t *)0x0;
    local_78.payload.field_1.curr_neigh = (int32_t *)0x0;
    local_78.payload.field_1.flows = (flow_t *)0x0;
    local_78.payload.field_1.height = (int32_t *)0x0;
    local_78.nnodes = 0;
    local_78.s = 0;
    local_78.t = 0;
    local_78.kind = MAXFLOW_ALGO_INVALID;
    local_98.nnodes = 0;
    local_98.s = 0;
    local_98.t = 0;
    local_98.maxflow = 0;
    local_98.colors = (int *)0x0;
    flow_network_create(&local_a8,4);
    max_flow_create(&local_78,4,MAXFLOW_ALGO_PUSH_RELABEL);
    max_flow_result_create(&local_98,4);
    if (local_a8.nnodes < 1) goto LAB_00103e66;
    *local_a8.caps = 0;
    if ((long)local_a8.nnodes < 1) goto LAB_00103e66;
    if (((local_a8.nnodes == 1) || (local_a8.caps[1] = 0x50, (uint)local_a8.nnodes < 3)) ||
       (local_a8.caps[2] = 0x50, local_a8.nnodes == 3)) goto LAB_00103e85;
    local_a8.caps[3] = 0;
    local_a8.caps[local_a8.nnodes] = 0;
    if ((long)local_a8.nnodes < 2) goto LAB_00103e66;
    local_a8.caps[(long)local_a8.nnodes + 1] = 0;
    if ((long)local_a8.nnodes < 2) goto LAB_00103e66;
    if (local_a8.nnodes == 2) goto LAB_00103e85;
    local_a8.caps[(long)local_a8.nnodes + 2] = 0;
    if ((long)local_a8.nnodes < 2) goto LAB_00103e66;
    if ((uint)local_a8.nnodes < 4) goto LAB_00103e85;
    local_a8.caps[(long)local_a8.nnodes + 3] = 0;
    if (local_a8.nnodes < 3) goto LAB_00103e66;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 2] = 0x14;
    if (local_a8.nnodes < 3) goto LAB_00103e66;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 2 + 1] = 0x3c;
    if (local_a8.nnodes < 3) goto LAB_00103e66;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 2 + 2] = 0;
    if (local_a8.nnodes < 3) goto LAB_00103e66;
    if (local_a8.nnodes == 3) goto LAB_00103e85;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 2 + 3] = 0x3c;
    if (local_a8.nnodes < 4) goto LAB_00103e66;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 3] = 0;
    if (local_a8.nnodes < 4) goto LAB_00103e66;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 3 + 1] = 0x14;
    if (local_a8.nnodes < 4) goto LAB_00103e66;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 3 + 2] = 0x50;
    if (local_a8.nnodes < 4) goto LAB_00103e66;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 3 + 3] = 0;
    max_flow_single_pair(&local_a8,&local_78,2,3,&local_98);
    gVar7 = validate_with_slow_max_flow(&local_a8,2,3,&local_98);
    iVar18 = -1;
    if (gVar7 == GREATEST_TEST_RES_PASS) {
      max_flow_result_destroy(&local_98);
      max_flow_destroy(&local_78);
      flow_network_destroy(&local_a8);
      greatest_info.msg = (char *)0x0;
      iVar18 = 0;
    }
    greatest_test_post(iVar18);
  }
  iVar18 = greatest_test_pre("weird_network3");
  if (iVar18 == 1) {
    local_a8._0_8_ = 0;
    local_a8.caps = (flow_t *)0x0;
    local_78.payload._32_8_ = 0;
    local_78.payload.field_1.list = (int32_t *)0x0;
    local_78.payload.field_0.temp_mf.colors = (int32_t *)0x0;
    local_78.payload.field_1.curr_neigh = (int32_t *)0x0;
    local_78.payload.field_1.flows = (flow_t *)0x0;
    local_78.payload.field_1.height = (int32_t *)0x0;
    local_78.nnodes = 0;
    local_78.s = 0;
    local_78.t = 0;
    local_78.kind = MAXFLOW_ALGO_INVALID;
    local_98.nnodes = 0;
    local_98.s = 0;
    local_98.t = 0;
    local_98.maxflow = 0;
    local_98.colors = (int *)0x0;
    flow_network_create(&local_a8,5);
    max_flow_create(&local_78,5,MAXFLOW_ALGO_PUSH_RELABEL);
    max_flow_result_create(&local_98,5);
    if (local_a8.nnodes < 1) goto LAB_00103e66;
    *local_a8.caps = 0;
    if ((long)local_a8.nnodes < 1) goto LAB_00103e66;
    if (((local_a8.nnodes == 1) || (local_a8.caps[1] = 0x28, (uint)local_a8.nnodes < 3)) ||
       ((local_a8.caps[2] = 0x50, local_a8.nnodes == 3 ||
        (local_a8.caps[3] = 0x3c, (uint)local_a8.nnodes < 5)))) goto LAB_00103e85;
    local_a8.caps[4] = 0x50;
    local_a8.caps[local_a8.nnodes] = 0x50;
    if ((long)local_a8.nnodes < 2) goto LAB_00103e66;
    local_a8.caps[(long)local_a8.nnodes + 1] = 0;
    if ((long)local_a8.nnodes < 2) goto LAB_00103e66;
    if (local_a8.nnodes == 2) goto LAB_00103e85;
    local_a8.caps[(long)local_a8.nnodes + 2] = 0x14;
    if ((long)local_a8.nnodes < 2) goto LAB_00103e66;
    if ((uint)local_a8.nnodes < 4) goto LAB_00103e85;
    local_a8.caps[(long)local_a8.nnodes + 3] = 0x28;
    if ((long)local_a8.nnodes < 2) goto LAB_00103e66;
    if ((uint)local_a8.nnodes < 5) goto LAB_00103e85;
    local_a8.caps[(long)local_a8.nnodes + 4] = 0x50;
    if (local_a8.nnodes < 3) goto LAB_00103e66;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 2] = 0x50;
    if (local_a8.nnodes < 3) goto LAB_00103e66;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 2 + 1] = 0x3c;
    if (local_a8.nnodes < 3) goto LAB_00103e66;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 2 + 2] = 0;
    if (local_a8.nnodes < 3) goto LAB_00103e66;
    if (local_a8.nnodes == 3) goto LAB_00103e85;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 2 + 3] = 0x3c;
    if (local_a8.nnodes < 3) goto LAB_00103e66;
    if ((uint)local_a8.nnodes < 5) goto LAB_00103e85;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 2 + 4] = 0x50;
    if (local_a8.nnodes < 4) goto LAB_00103e66;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 3] = 0x28;
    if (local_a8.nnodes < 4) goto LAB_00103e66;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 3 + 1] = 0x3c;
    if (local_a8.nnodes < 4) goto LAB_00103e66;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 3 + 2] = 0x14;
    if (local_a8.nnodes < 4) goto LAB_00103e66;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 3 + 3] = 0;
    if (local_a8.nnodes < 4) goto LAB_00103e66;
    if (local_a8.nnodes == 4) goto LAB_00103e85;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 3 + 4] = 0x14;
    if (((local_a8.nnodes < 5) ||
        (local_a8.caps[(uint)(local_a8.nnodes << 2)] = 0, local_a8.nnodes < 5)) ||
       ((local_a8.caps[(ulong)(uint)(local_a8.nnodes << 2) + 1] = 0x28, local_a8.nnodes < 5 ||
        ((local_a8.caps[(ulong)(uint)(local_a8.nnodes << 2) + 2] = 0x50, local_a8.nnodes < 5 ||
         (local_a8.caps[(ulong)(uint)(local_a8.nnodes << 2) + 3] = 0x50, local_a8.nnodes < 5))))))
    goto LAB_00103e66;
    local_a8.caps[(ulong)(uint)(local_a8.nnodes << 2) + 4] = 0;
    max_flow_single_pair(&local_a8,&local_78,0,2,&local_98);
    gVar7 = validate_with_slow_max_flow(&local_a8,0,2,&local_98);
    iVar18 = -1;
    if (gVar7 == GREATEST_TEST_RES_PASS) {
      max_flow_result_destroy(&local_98);
      max_flow_destroy(&local_78);
      flow_network_destroy(&local_a8);
      greatest_info.msg = (char *)0x0;
      iVar18 = 0;
    }
    greatest_test_post(iVar18);
  }
  iVar18 = greatest_test_pre("CLRS_network");
  if (iVar18 == 1) {
    local_a8._0_8_ = 0;
    local_a8.caps = (flow_t *)0x0;
    local_78.payload._32_8_ = 0;
    local_78.payload.field_1.list = (int32_t *)0x0;
    local_78.payload.field_0.temp_mf.colors = (int32_t *)0x0;
    local_78.payload.field_1.curr_neigh = (int32_t *)0x0;
    local_78.payload.field_1.flows = (flow_t *)0x0;
    local_78.payload.field_1.height = (int32_t *)0x0;
    local_78.nnodes = 0;
    local_78.s = 0;
    local_78.t = 0;
    local_78.kind = MAXFLOW_ALGO_INVALID;
    local_98.nnodes = 0;
    local_98.s = 0;
    local_98.t = 0;
    local_98.maxflow = 0;
    local_98.colors = (int *)0x0;
    flow_network_create(&local_a8,6);
    max_flow_create(&local_78,6,MAXFLOW_ALGO_PUSH_RELABEL);
    max_flow_result_create(&local_98,6);
    if ((long)local_a8.nnodes < 1) goto LAB_00103e66;
    if ((local_a8.nnodes == 1) || (local_a8.caps[1] = 0x10, (uint)local_a8.nnodes < 3))
    goto LAB_00103e85;
    local_a8.caps[2] = 0xd;
    local_a8.caps[(long)local_a8.nnodes + 2] = 10;
    if (local_a8.nnodes < 3) goto LAB_00103e66;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 2 + 1] = 0x28;
    if ((long)local_a8.nnodes < 2) goto LAB_00103e66;
    if ((uint)local_a8.nnodes < 4) goto LAB_00103e85;
    local_a8.caps[(long)local_a8.nnodes + 3] = 0xc;
    if (local_a8.nnodes < 4) goto LAB_00103e66;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 3 + 2] = 9;
    if (local_a8.nnodes < 3) goto LAB_00103e66;
    if ((uint)local_a8.nnodes < 5) goto LAB_00103e85;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 2 + 4] = 0xe;
    if (local_a8.nnodes < 5) goto LAB_00103e66;
    local_a8.caps[(ulong)(uint)(local_a8.nnodes << 2) + 3] = 7;
    if (local_a8.nnodes < 4) goto LAB_00103e66;
    if ((uint)local_a8.nnodes < 6) goto LAB_00103e85;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 3 + 5] = 0x14;
    if (local_a8.nnodes < 5) goto LAB_00103e66;
    if (local_a8.nnodes == 5) goto LAB_00103e85;
    local_a8.caps[(ulong)(uint)(local_a8.nnodes << 2) + 5] = 4;
    fVar8 = max_flow_single_pair(&local_a8,&local_78,0,5,&local_98);
    if (fVar8 == 0x17) {
      if (*local_98.colors != 0) {
        greatest_info.fail_line = 0x107;
        greatest_info.msg = "BLACK != result.colors[0]";
        greatest_info.assertions = greatest_info.assertions + 2;
        goto LAB_001028c4;
      }
      if (local_98.colors[1] != 0) {
        greatest_info.fail_line = 0x108;
        greatest_info.msg = "BLACK != result.colors[1]";
        greatest_info.assertions = greatest_info.assertions + 3;
        goto LAB_001028c4;
      }
      if (local_98.colors[2] != 0) {
        greatest_info.fail_line = 0x109;
        greatest_info.msg = "BLACK != result.colors[2]";
        greatest_info.assertions = greatest_info.assertions + 4;
        goto LAB_001028c4;
      }
      if (local_98.colors[3] != 1) {
        greatest_info.fail_line = 0x10a;
        greatest_info.msg = "WHITE != result.colors[3]";
        greatest_info.assertions = greatest_info.assertions + 5;
        goto LAB_001028c4;
      }
      if (local_98.colors[4] != 0) {
        greatest_info.fail_line = 0x10b;
        greatest_info.msg = "BLACK != result.colors[4]";
        greatest_info.assertions = greatest_info.assertions + 6;
        goto LAB_001028c4;
      }
      greatest_info.assertions = greatest_info.assertions + 7;
      if (local_98.colors[5] != 1) {
        greatest_info.fail_line = 0x10c;
        greatest_info.msg = "WHITE != result.colors[5]";
        goto LAB_001028c4;
      }
      gVar7 = validate_with_slow_max_flow(&local_a8,0,5,&local_98);
      iVar18 = -1;
      if (gVar7 == GREATEST_TEST_RES_PASS) {
        max_flow_result_destroy(&local_98);
        max_flow_destroy(&local_78);
        flow_network_destroy(&local_a8);
        greatest_info.msg = (char *)0x0;
        iVar18 = 0;
      }
    }
    else {
      greatest_info.fail_line = 0x106;
      greatest_info.msg = "23 != max_flow";
      greatest_info.assertions = greatest_info.assertions + 1;
LAB_001028c4:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
      ;
      iVar18 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00104123;
    }
    greatest_test_post(iVar18);
  }
  iVar18 = greatest_test_pre("non_trivial_network1");
  if (iVar18 == 1) {
    local_a8._0_8_ = 0;
    local_a8.caps = (flow_t *)0x0;
    local_78.payload._32_8_ = 0;
    local_78.payload.field_1.list = (int32_t *)0x0;
    local_78.payload.field_0.temp_mf.colors = (int32_t *)0x0;
    local_78.payload.field_1.curr_neigh = (int32_t *)0x0;
    local_78.payload.field_1.flows = (flow_t *)0x0;
    local_78.payload.field_1.height = (int32_t *)0x0;
    local_78.nnodes = 0;
    local_78.s = 0;
    local_78.t = 0;
    local_78.kind = MAXFLOW_ALGO_INVALID;
    local_98.nnodes = 0;
    local_98.s = 0;
    local_98.t = 0;
    local_98.maxflow = 0;
    local_98.colors = (int *)0x0;
    flow_network_create(&local_a8,7);
    max_flow_create(&local_78,7,MAXFLOW_ALGO_PUSH_RELABEL);
    max_flow_result_create(&local_98,7);
    if (local_a8.nnodes < 1) goto LAB_00103e66;
    if ((uint)local_a8.nnodes < 4) goto LAB_00103e85;
    local_a8.caps[3] = 2;
    local_a8.caps[1] = 2;
    if (local_a8.nnodes == 4) goto LAB_00103e85;
    local_a8.caps[4] = 2;
    local_a8.caps[(ulong)(uint)(local_a8.nnodes << 2) + 1] = 1;
    if ((long)local_a8.nnodes < 2) goto LAB_00103e66;
    if ((uint)local_a8.nnodes < 4) goto LAB_00103e85;
    local_a8.caps[(long)local_a8.nnodes + 3] = 1;
    if (local_a8.nnodes < 5) goto LAB_00103e66;
    if (local_a8.nnodes == 5) goto LAB_00103e85;
    local_a8.caps[(ulong)(uint)(local_a8.nnodes << 2) + 5] = 2;
    if ((long)local_a8.nnodes < 2) goto LAB_00103e66;
    if ((uint)local_a8.nnodes < 6) goto LAB_00103e85;
    local_a8.caps[(long)local_a8.nnodes + 5] = 2;
    if ((long)local_a8.nnodes < 2) goto LAB_00103e66;
    if (local_a8.nnodes == 2) goto LAB_00103e85;
    local_a8.caps[(long)local_a8.nnodes + 2] = 2;
    if (local_a8.nnodes < 4) goto LAB_00103e66;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 3 + 2] = 1;
    if (local_a8.nnodes < 6) goto LAB_00103e66;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 5 + 2] = 1;
    if (local_a8.nnodes < 3) goto LAB_00103e66;
    if ((uint)local_a8.nnodes < 7) goto LAB_00103e85;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 2 + 6] = 2;
    if (local_a8.nnodes < 6) goto LAB_00103e66;
    if (local_a8.nnodes == 6) goto LAB_00103e85;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 5 + 6] = 4;
    fVar8 = max_flow_single_pair(&local_a8,&local_78,0,6,&local_98);
    if (fVar8 == 5) {
      if (*local_98.colors != 0) {
        greatest_info.fail_line = 0x138;
        greatest_info.msg = "BLACK != result.colors[1 - 1]";
        greatest_info.assertions = greatest_info.assertions + 2;
        goto LAB_00102b33;
      }
      if (local_98.colors[1] != 1) {
        greatest_info.fail_line = 0x139;
        greatest_info.msg = "WHITE != result.colors[2 - 1]";
        greatest_info.assertions = greatest_info.assertions + 3;
        goto LAB_00102b33;
      }
      if (local_98.colors[2] != 1) {
        greatest_info.fail_line = 0x13a;
        greatest_info.msg = "WHITE != result.colors[3 - 1]";
        greatest_info.assertions = greatest_info.assertions + 4;
        goto LAB_00102b33;
      }
      if (local_98.colors[3] != 0) {
        greatest_info.fail_line = 0x13b;
        greatest_info.msg = "BLACK != result.colors[4 - 1]";
        greatest_info.assertions = greatest_info.assertions + 5;
        goto LAB_00102b33;
      }
      if (local_98.colors[4] != 1) {
        greatest_info.fail_line = 0x13c;
        greatest_info.msg = "WHITE != result.colors[5 - 1]";
        greatest_info.assertions = greatest_info.assertions + 6;
        goto LAB_00102b33;
      }
      if (local_98.colors[5] != 1) {
        greatest_info.fail_line = 0x13d;
        greatest_info.msg = "WHITE != result.colors[6 - 1]";
        greatest_info.assertions = greatest_info.assertions + 7;
        goto LAB_00102b33;
      }
      greatest_info.assertions = greatest_info.assertions + 8;
      if (local_98.colors[6] != 1) {
        greatest_info.fail_line = 0x13e;
        greatest_info.msg = "WHITE != result.colors[7 - 1]";
        goto LAB_00102b33;
      }
      gVar7 = validate_with_slow_max_flow(&local_a8,0,6,&local_98);
      iVar18 = -1;
      if (gVar7 == GREATEST_TEST_RES_PASS) {
        max_flow_result_destroy(&local_98);
        max_flow_destroy(&local_78);
        flow_network_destroy(&local_a8);
        greatest_info.msg = (char *)0x0;
        iVar18 = 0;
      }
    }
    else {
      greatest_info.fail_line = 0x137;
      greatest_info.msg = "5 != max_flow";
      greatest_info.assertions = greatest_info.assertions + 1;
LAB_00102b33:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
      ;
      iVar18 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00104123;
    }
    greatest_test_post(iVar18);
  }
  iVar18 = greatest_test_pre("non_trivial_network2");
  if (iVar18 == 1) {
    local_a8._0_8_ = 0;
    local_a8.caps = (flow_t *)0x0;
    local_78.payload._32_8_ = 0;
    local_78.payload.field_1.list = (int32_t *)0x0;
    local_78.payload.field_0.temp_mf.colors = (int32_t *)0x0;
    local_78.payload.field_1.curr_neigh = (int32_t *)0x0;
    local_78.payload.field_1.flows = (flow_t *)0x0;
    local_78.payload.field_1.height = (int32_t *)0x0;
    local_78.nnodes = 0;
    local_78.s = 0;
    local_78.t = 0;
    local_78.kind = MAXFLOW_ALGO_INVALID;
    local_98.nnodes = 0;
    local_98.s = 0;
    local_98.t = 0;
    local_98.maxflow = 0;
    local_98.colors = (int *)0x0;
    flow_network_create(&local_a8,7);
    max_flow_create(&local_78,7,MAXFLOW_ALGO_PUSH_RELABEL);
    max_flow_result_create(&local_98,7);
    if (local_a8.nnodes < 1) goto LAB_00103e66;
    if (((local_a8.nnodes == 1) || (local_a8.caps[1] = 6, (uint)local_a8.nnodes < 4)) ||
       (local_a8.caps[3] = 5, local_a8.nnodes == 4)) goto LAB_00103e85;
    local_a8.caps[4] = 10;
    local_a8.caps[(ulong)(uint)(local_a8.nnodes << 2) + 3] = 0xc;
    if (local_a8.nnodes < 4) goto LAB_00103e66;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 3 + 1] = 5;
    if (local_a8.nnodes < 4) goto LAB_00103e66;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 3 + 2] = 7;
    if ((long)local_a8.nnodes < 2) goto LAB_00103e66;
    if (local_a8.nnodes == 2) goto LAB_00103e85;
    local_a8.caps[(long)local_a8.nnodes + 2] = 5;
    if ((long)local_a8.nnodes < 2) goto LAB_00103e66;
    if ((uint)local_a8.nnodes < 6) goto LAB_00103e85;
    local_a8.caps[(long)local_a8.nnodes + 5] = 0xc;
    if ((long)local_a8.nnodes < 2) goto LAB_00103e66;
    if ((uint)local_a8.nnodes < 6) goto LAB_00103e85;
    local_a8.caps[(long)local_a8.nnodes + 5] = 0xc;
    if (local_a8.nnodes < 6) goto LAB_00103e66;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 5 + 2] = 3;
    if (local_a8.nnodes < 6) goto LAB_00103e66;
    if (local_a8.nnodes == 6) goto LAB_00103e85;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 5 + 6] = 0xf;
    if (local_a8.nnodes < 3) goto LAB_00103e66;
    if ((uint)local_a8.nnodes < 7) goto LAB_00103e85;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 2 + 6] = 4;
    fVar8 = max_flow_single_pair(&local_a8,&local_78,0,6,&local_98);
    if (fVar8 == 0xf) {
      if (*local_98.colors != 0) {
        greatest_info.fail_line = 0x16a;
        greatest_info.msg = "BLACK != result.colors[1 - 1]";
        greatest_info.assertions = greatest_info.assertions + 2;
        goto LAB_00102da6;
      }
      if (local_98.colors[1] != 1) {
        greatest_info.fail_line = 0x16b;
        greatest_info.msg = "WHITE != result.colors[2 - 1]";
        greatest_info.assertions = greatest_info.assertions + 3;
        goto LAB_00102da6;
      }
      if (local_98.colors[2] != 0) {
        greatest_info.fail_line = 0x16c;
        greatest_info.msg = "BLACK != result.colors[3 - 1]";
        greatest_info.assertions = greatest_info.assertions + 4;
        goto LAB_00102da6;
      }
      if (local_98.colors[3] != 0) {
        greatest_info.fail_line = 0x16d;
        greatest_info.msg = "BLACK != result.colors[4 - 1]";
        greatest_info.assertions = greatest_info.assertions + 5;
        goto LAB_00102da6;
      }
      if (local_98.colors[4] != 0) {
        greatest_info.fail_line = 0x16e;
        greatest_info.msg = "BLACK != result.colors[5 - 1]";
        greatest_info.assertions = greatest_info.assertions + 6;
        goto LAB_00102da6;
      }
      if (local_98.colors[5] != 1) {
        greatest_info.fail_line = 0x16f;
        greatest_info.msg = "WHITE != result.colors[6 - 1]";
        greatest_info.assertions = greatest_info.assertions + 7;
        goto LAB_00102da6;
      }
      greatest_info.assertions = greatest_info.assertions + 8;
      if (local_98.colors[6] != 1) {
        greatest_info.fail_line = 0x170;
        greatest_info.msg = "WHITE != result.colors[7 - 1]";
        goto LAB_00102da6;
      }
      gVar7 = validate_with_slow_max_flow(&local_a8,0,6,&local_98);
      iVar18 = -1;
      if (gVar7 == GREATEST_TEST_RES_PASS) {
        max_flow_result_destroy(&local_98);
        max_flow_destroy(&local_78);
        flow_network_destroy(&local_a8);
        greatest_info.msg = (char *)0x0;
        iVar18 = 0;
      }
    }
    else {
      greatest_info.fail_line = 0x169;
      greatest_info.msg = "15 != max_flow";
      greatest_info.assertions = greatest_info.assertions + 1;
LAB_00102da6:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
      ;
      iVar18 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00104123;
    }
    greatest_test_post(iVar18);
  }
  iVar18 = greatest_test_pre("non_trivial_network3");
  if (iVar18 == 1) {
    local_a8._0_8_ = 0;
    local_a8.caps = (flow_t *)0x0;
    local_78.payload._32_8_ = 0;
    local_78.payload.field_1.list = (int32_t *)0x0;
    local_78.payload.field_0.temp_mf.colors = (int32_t *)0x0;
    local_78.payload.field_1.curr_neigh = (int32_t *)0x0;
    local_78.payload.field_1.flows = (flow_t *)0x0;
    local_78.payload.field_1.height = (int32_t *)0x0;
    local_78.nnodes = 0;
    local_78.s = 0;
    local_78.t = 0;
    local_78.kind = MAXFLOW_ALGO_INVALID;
    local_98.nnodes = 0;
    local_98.s = 0;
    local_98.t = 0;
    local_98.maxflow = 0;
    local_98.colors = (int *)0x0;
    flow_network_create(&local_a8,8);
    max_flow_create(&local_78,8,MAXFLOW_ALGO_PUSH_RELABEL);
    max_flow_result_create(&local_98,8);
    if (local_a8.nnodes < 1) goto LAB_00103e66;
    if ((uint)local_a8.nnodes < 5) goto LAB_00103e85;
    local_a8.caps[4] = 7;
    local_a8.caps[1] = 3;
    if (local_a8.nnodes == 5) goto LAB_00103e85;
    local_a8.caps[5] = 3;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 5 + 1] = 5;
    if (local_a8.nnodes < 5) goto LAB_00103e66;
    local_a8.caps[(ulong)(uint)(local_a8.nnodes << 2) + 1] = 1;
    if ((long)local_a8.nnodes < 2) goto LAB_00103e66;
    if (local_a8.nnodes == 2) goto LAB_00103e85;
    local_a8.caps[(long)local_a8.nnodes + 2] = 2;
    if (local_a8.nnodes < 5) goto LAB_00103e66;
    local_a8.caps[(ulong)(uint)(local_a8.nnodes << 2) + 3] = 7;
    if (local_a8.nnodes < 4) goto LAB_00103e66;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 3 + 1] = 2;
    if (local_a8.nnodes < 6) goto LAB_00103e66;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 5 + 2] = 3;
    if (local_a8.nnodes < 6) goto LAB_00103e66;
    if (local_a8.nnodes == 6) goto LAB_00103e85;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 5 + 6] = 3;
    if (local_a8.nnodes < 3) goto LAB_00103e66;
    if ((uint)local_a8.nnodes < 7) goto LAB_00103e85;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 2 + 6] = 5;
    if (local_a8.nnodes < 3) goto LAB_00103e66;
    if (local_a8.nnodes == 3) goto LAB_00103e85;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 2 + 3] = 2;
    if (local_a8.nnodes < 7) goto LAB_00103e66;
    if (local_a8.nnodes == 7) goto LAB_00103e85;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 6 + 7] = 6;
    if (local_a8.nnodes < 4) goto LAB_00103e66;
    if ((uint)local_a8.nnodes < 8) goto LAB_00103e85;
    local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 3 + 7] = 5;
    fVar8 = max_flow_single_pair(&local_a8,&local_78,0,7,&local_98);
    if (fVar8 == 10) {
      if (*local_98.colors != 0) {
        greatest_info.fail_line = 0x19d;
        greatest_info.msg = "BLACK != result.colors[1 - 1]";
        greatest_info.assertions = greatest_info.assertions + 2;
        goto LAB_0010304d;
      }
      if (local_98.colors[1] != 0) {
        greatest_info.fail_line = 0x19e;
        greatest_info.msg = "BLACK != result.colors[2 - 1]";
        greatest_info.assertions = greatest_info.assertions + 3;
        goto LAB_0010304d;
      }
      if (local_98.colors[2] != 1) {
        greatest_info.fail_line = 0x19f;
        greatest_info.msg = "WHITE != result.colors[3 - 1]";
        greatest_info.assertions = greatest_info.assertions + 4;
        goto LAB_0010304d;
      }
      if (local_98.colors[3] != 0) {
        greatest_info.fail_line = 0x1a0;
        greatest_info.msg = "BLACK != result.colors[4 - 1]";
        greatest_info.assertions = greatest_info.assertions + 5;
        goto LAB_0010304d;
      }
      if (local_98.colors[4] != 0) {
        greatest_info.fail_line = 0x1a1;
        greatest_info.msg = "BLACK != result.colors[5 - 1]";
        greatest_info.assertions = greatest_info.assertions + 6;
        goto LAB_0010304d;
      }
      if (local_98.colors[5] != 1) {
        greatest_info.fail_line = 0x1a2;
        greatest_info.msg = "WHITE != result.colors[6 - 1]";
        greatest_info.assertions = greatest_info.assertions + 7;
        goto LAB_0010304d;
      }
      if (local_98.colors[6] != 1) {
        greatest_info.fail_line = 0x1a3;
        greatest_info.msg = "WHITE != result.colors[7 - 1]";
        greatest_info.assertions = greatest_info.assertions + 8;
        goto LAB_0010304d;
      }
      greatest_info.assertions = greatest_info.assertions + 9;
      if (local_98.colors[7] != 1) {
        greatest_info.fail_line = 0x1a4;
        greatest_info.msg = "WHITE != result.colors[8 - 1]";
        goto LAB_0010304d;
      }
      gVar7 = validate_with_slow_max_flow(&local_a8,0,7,&local_98);
      iVar18 = -1;
      if (gVar7 == GREATEST_TEST_RES_PASS) {
        max_flow_result_destroy(&local_98);
        max_flow_destroy(&local_78);
        flow_network_destroy(&local_a8);
        greatest_info.msg = (char *)0x0;
        iVar18 = 0;
      }
    }
    else {
      greatest_info.fail_line = 0x19c;
      greatest_info.msg = "10 != max_flow";
      greatest_info.assertions = greatest_info.assertions + 1;
LAB_0010304d:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
      ;
      iVar18 = -1;
      if ((greatest_info.flags & 4) != 0) goto LAB_00104123;
    }
    greatest_test_post(iVar18);
  }
  iVar18 = greatest_test_pre("no_path_flow");
  if (iVar18 != 1) goto LAB_00103735;
  local_a8._0_8_ = 0;
  local_a8.caps = (flow_t *)0x0;
  local_78.payload._32_8_ = 0;
  local_78.payload.field_1.list = (int32_t *)0x0;
  local_78.payload.field_0.temp_mf.colors = (int32_t *)0x0;
  local_78.payload.field_1.curr_neigh = (int32_t *)0x0;
  local_78.payload.field_1.flows = (flow_t *)0x0;
  local_78.payload.field_1.height = (int32_t *)0x0;
  local_78.nnodes = 0;
  local_78.s = 0;
  local_78.t = 0;
  local_78.kind = MAXFLOW_ALGO_INVALID;
  local_98.nnodes = 0;
  local_98.s = 0;
  local_98.t = 0;
  local_98.maxflow = 0;
  local_98.colors = (int *)0x0;
  flow_network_create(&local_a8,4);
  max_flow_create(&local_78,4,MAXFLOW_ALGO_PUSH_RELABEL);
  max_flow_result_create(&local_98,4);
  if ((long)local_a8.nnodes < 1) goto LAB_00103e66;
  if (local_a8.nnodes == 1) {
LAB_00103e85:
    __assert_fail("j >= 0 && j < net->nnodes",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/../src/maxflow.h"
                  ,0x71,"void flow_net_set_cap(FlowNetwork *, int32_t, int32_t, flow_t)");
  }
  local_a8.caps[1] = 2;
  local_a8.caps[local_a8.nnodes] = 2;
  if ((long)local_a8.nnodes < 2) goto LAB_00103e66;
  if (local_a8.nnodes == 2) goto LAB_00103e85;
  local_a8.caps[(long)local_a8.nnodes + 2] = 2;
  if (local_a8.nnodes < 3) {
LAB_00103e66:
    __assert_fail("i >= 0 && i < net->nnodes",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/../src/maxflow.h"
                  ,0x70,"void flow_net_set_cap(FlowNetwork *, int32_t, int32_t, flow_t)");
  }
  local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 2 + 1] = 2;
  if ((local_a8.nnodes < 3) ||
     (local_a8.caps[(local_a8._0_8_ & 0xffffffff) * 2] = 2, local_a8.nnodes < 1)) goto LAB_00103e66;
  if ((uint)local_a8.nnodes < 3) goto LAB_00103e85;
  local_a8.caps[2] = 2;
  fVar8 = max_flow_single_pair(&local_a8,&local_78,0,3,&local_98);
  if (fVar8 == 0) {
    if (*local_98.colors != 0) {
      greatest_info.fail_line = 0x1ca;
      greatest_info.msg = "BLACK != result.colors[0]";
      greatest_info.assertions = greatest_info.assertions + 2;
      goto LAB_00103717;
    }
    if (local_98.colors[1] != 0) {
      greatest_info.fail_line = 0x1cb;
      greatest_info.msg = "BLACK != result.colors[1]";
      greatest_info.assertions = greatest_info.assertions + 3;
      goto LAB_00103717;
    }
    if (local_98.colors[2] != 0) {
      greatest_info.fail_line = 0x1cc;
      greatest_info.msg = "BLACK != result.colors[2]";
      greatest_info.assertions = greatest_info.assertions + 4;
      goto LAB_00103717;
    }
    greatest_info.assertions = greatest_info.assertions + 5;
    if (local_98.colors[3] != 1) {
      greatest_info.fail_line = 0x1cd;
      greatest_info.msg = "WHITE != result.colors[3]";
      goto LAB_00103717;
    }
    gVar7 = validate_with_slow_max_flow(&local_a8,0,3,&local_98);
    iVar18 = -1;
    if (gVar7 == GREATEST_TEST_RES_PASS) {
      max_flow_result_destroy(&local_98);
      max_flow_destroy(&local_78);
      flow_network_destroy(&local_a8);
      greatest_info.msg = (char *)0x0;
      iVar18 = 0;
    }
  }
  else {
    greatest_info.fail_line = 0x1c9;
    greatest_info.msg = "0 != max_flow";
    greatest_info.assertions = greatest_info.assertions + 1;
LAB_00103717:
    greatest_info.fail_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
    ;
    iVar18 = -1;
    if ((greatest_info.flags & 4) != 0) {
LAB_00104123:
      greatest_info.fail_file =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
      ;
      abort();
    }
  }
  greatest_test_post(iVar18);
LAB_00103735:
  iVar18 = greatest_test_pre("single_path_flow");
  if (iVar18 == 1) {
    uVar15 = 2;
    iVar18 = 1;
    do {
      local_a8._0_8_ = 0;
      local_a8.caps = (flow_t *)0x0;
      local_78.payload._32_8_ = 0;
      local_78.payload.field_1.list = (int32_t *)0x0;
      local_78.payload.field_0.temp_mf.colors = (int32_t *)0x0;
      local_78.payload.field_1.curr_neigh = (int32_t *)0x0;
      local_78.payload.field_1.flows = (flow_t *)0x0;
      local_78.payload.field_1.height = (int32_t *)0x0;
      local_78.nnodes = 0;
      local_78.s = 0;
      local_78.t = 0;
      local_78.kind = MAXFLOW_ALGO_INVALID;
      local_98.nnodes = 0;
      local_98.s = 0;
      local_98.t = 0;
      local_98.maxflow = 0;
      local_98.colors = (int *)0x0;
      iVar12 = (int)uVar15;
      flow_network_create(&local_a8,iVar12);
      max_flow_create(&local_78,iVar12,MAXFLOW_ALGO_PUSH_RELABEL);
      max_flow_result_create(&local_98,iVar12);
      iVar11 = 0x7fffffff;
      iVar19 = 1;
      iVar16 = 0;
      local_80 = uVar15;
      do {
        iVar9 = rand();
        iVar10 = rand();
        if (local_a8.nnodes <= iVar16) goto LAB_00103e66;
        iVar1 = iVar16 + 1;
        if (local_a8.nnodes <= iVar1) goto LAB_00103e85;
        iVar9 = iVar9 % 10;
        local_a8.caps[local_a8.nnodes * iVar16 + iVar16 + 1] = iVar9;
        if (local_a8.nnodes <= iVar1) goto LAB_00103e66;
        if (iVar9 <= iVar11) {
          iVar11 = iVar9;
        }
        local_a8.caps[(uint)(iVar16 + local_a8.nnodes * iVar19)] = iVar10 % 10;
        iVar19 = iVar19 + 1;
        iVar16 = iVar1;
      } while (iVar18 != iVar1);
      fVar8 = max_flow_single_pair(&local_a8,&local_78,0,iVar12 + -1,&local_98);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (iVar11 != fVar8) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
        ;
        greatest_info.fail_line = 499;
        greatest_info.msg = "min_cap != max_flow";
        if ((greatest_info.flags & 4) != 0) goto LAB_00104123;
LAB_0010390b:
        iVar18 = -1;
        goto LAB_00103910;
      }
      gVar7 = validate_with_slow_max_flow(&local_a8,0,iVar12 + -1,&local_98);
      if (gVar7 != GREATEST_TEST_RES_PASS) goto LAB_0010390b;
      max_flow_result_destroy(&local_98);
      max_flow_destroy(&local_78);
      flow_network_destroy(&local_a8);
      uVar15 = (ulong)((int)local_80 + 1);
      iVar18 = iVar18 + 1;
    } while (iVar18 != 9);
    greatest_info.msg = (char *)0x0;
    iVar18 = 0;
LAB_00103910:
    greatest_test_post(iVar18);
  }
  iVar18 = greatest_test_pre("two_path_flow");
  if (iVar18 == 1) {
    uVar15 = 2;
    do {
      iVar18 = (int)uVar15;
      iVar16 = iVar18 * 2 + 2;
      local_a8._0_8_ = 0;
      local_a8.caps = (flow_t *)0x0;
      local_78.payload._32_8_ = 0;
      local_78.payload.field_1.list = (int32_t *)0x0;
      local_78.payload.field_0.temp_mf.colors = (int32_t *)0x0;
      local_78.payload.field_1.curr_neigh = (int32_t *)0x0;
      local_78.payload.field_1.flows = (flow_t *)0x0;
      local_78.payload.field_1.height = (int32_t *)0x0;
      local_78.nnodes = 0;
      local_78.s = 0;
      local_78.t = 0;
      local_78.kind = MAXFLOW_ALGO_INVALID;
      local_98.nnodes = 0;
      local_98.s = 0;
      local_98.t = 0;
      local_98.maxflow = 0;
      local_98.colors = (int *)0x0;
      flow_network_create(&local_a8,iVar16);
      max_flow_create(&local_78,iVar16,MAXFLOW_ALGO_PUSH_RELABEL);
      max_flow_result_create(&local_98,iVar16);
      if (local_a8.nnodes < 1) goto LAB_00103e66;
      if ((local_a8.nnodes == 1) || (local_a8.caps[1] = 99999, (uint)local_a8.nnodes < 3))
      goto LAB_00103e85;
      uVar14 = iVar18 * 2;
      local_a8.caps[2] = 99999;
      if ((uint)local_a8.nnodes <= uVar14 - 1) goto LAB_00103e66;
      uVar17 = iVar18 * 2 + 1;
      if ((uint)local_a8.nnodes <= uVar17) goto LAB_00103e85;
      local_a8.caps[local_a8.nnodes * (uVar14 - 1) + uVar17] = 99999;
      if (local_a8.nnodes == uVar14 ||
          SBORROW4(local_a8.nnodes,uVar14) != local_a8.nnodes + iVar18 * -2 < 0) goto LAB_00103e66;
      if ((uint)local_a8.nnodes <= uVar17) goto LAB_00103e85;
      local_a8.caps[local_a8.nnodes * uVar14 + uVar17] = 99999;
      iVar18 = 0x7fffffff;
      iVar16 = 3;
      uVar20 = 1;
      local_38 = uVar15;
      do {
        iVar11 = rand();
        iVar12 = rand();
        if (local_a8.nnodes <= (int)uVar20) goto LAB_00103e66;
        uVar2 = uVar20 + 2;
        if (local_a8.nnodes <= (int)uVar2) goto LAB_00103e85;
        iVar11 = iVar11 % 10;
        local_a8.caps[local_a8.nnodes * uVar20 + uVar20 + 2] = iVar11;
        if (local_a8.nnodes <= (int)uVar2) goto LAB_00103e66;
        if (iVar11 <= iVar18) {
          iVar18 = iVar11;
        }
        local_a8.caps[uVar20 + local_a8.nnodes * iVar16] = iVar12 % 10;
        iVar16 = iVar16 + 2;
        uVar20 = uVar2;
      } while (uVar2 < uVar14);
      local_80 = CONCAT44(local_80._4_4_,uVar17);
      iVar16 = 0x7fffffff;
      iVar11 = 4;
      uVar17 = 2;
      do {
        iVar12 = rand();
        iVar19 = rand();
        if (local_a8.nnodes <= (int)uVar17) goto LAB_00103e66;
        uVar20 = uVar17 + 2;
        if (local_a8.nnodes <= (int)uVar20) goto LAB_00103e85;
        iVar12 = iVar12 % 10;
        local_a8.caps[local_a8.nnodes * uVar17 + uVar17 + 2] = iVar12;
        if (local_a8.nnodes <= (int)uVar20) goto LAB_00103e66;
        if (iVar12 <= iVar16) {
          iVar16 = iVar12;
        }
        local_a8.caps[uVar17 + local_a8.nnodes * iVar11] = iVar19 % 10;
        iVar11 = iVar11 + 2;
        uVar17 = uVar20;
      } while (uVar20 < uVar14);
      iVar5 = (int32_t)local_80;
      fVar8 = max_flow_single_pair(&local_a8,&local_78,0,(int32_t)local_80,&local_98);
      greatest_info.assertions = greatest_info.assertions + 1;
      if (iVar16 + iVar18 != fVar8) {
        greatest_info.fail_file =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
        ;
        greatest_info.fail_line = 0x236;
        greatest_info.msg = "min_cap1 + min_cap2 != max_flow";
        if ((greatest_info.flags & 4) != 0) goto LAB_00104123;
LAB_00103c36:
        iVar18 = -1;
        goto LAB_00103c3b;
      }
      gVar7 = validate_with_slow_max_flow(&local_a8,0,iVar5,&local_98);
      if (gVar7 != GREATEST_TEST_RES_PASS) goto LAB_00103c36;
      max_flow_result_destroy(&local_98);
      max_flow_destroy(&local_78);
      flow_network_destroy(&local_a8);
      uVar14 = (int)local_38 + 1;
      uVar15 = (ulong)uVar14;
    } while (uVar14 != 5);
    greatest_info.msg = (char *)0x0;
    iVar18 = 0;
LAB_00103c3b:
    greatest_test_post(iVar18);
  }
  iVar18 = greatest_test_pre("random_networks");
  if (iVar18 == 1) {
    iVar18 = 2;
    do {
      local_38 = CONCAT44(local_38._4_4_,iVar18 + -1);
      iVar16 = 0;
      do {
        local_80 = CONCAT44(local_80._4_4_,iVar16);
        local_a8._0_8_ = 0;
        local_a8.caps = (flow_t *)0x0;
        local_78.payload._32_8_ = 0;
        local_78.payload.field_1.list = (int32_t *)0x0;
        local_78.payload.field_0.temp_mf.colors = (int32_t *)0x0;
        local_78.payload.field_1.curr_neigh = (int32_t *)0x0;
        local_78.payload.field_1.flows = (flow_t *)0x0;
        local_78.payload.field_1.height = (int32_t *)0x0;
        local_78.nnodes = 0;
        local_78.s = 0;
        local_78.t = 0;
        local_78.kind = MAXFLOW_ALGO_INVALID;
        local_98.nnodes = 0;
        local_98.s = 0;
        local_98.t = 0;
        local_98.maxflow = 0;
        local_98.colors = (int *)0x0;
        flow_network_create(&local_a8,iVar18);
        max_flow_create(&local_78,iVar18,MAXFLOW_ALGO_PUSH_RELABEL);
        max_flow_result_create(&local_98,iVar18);
        iVar16 = 0;
        iVar5 = (int32_t)local_38;
        do {
          iVar11 = 0;
          do {
            if (iVar16 != iVar11) {
              iVar12 = rand();
              auVar4._8_8_ = 0;
              auVar4._0_8_ = (long)iVar12;
              if (local_a8.nnodes <= iVar16) goto LAB_00103e66;
              if (local_a8.nnodes <= iVar11) goto LAB_00103e85;
              local_a8.caps[(uint)(local_a8.nnodes * iVar16 + iVar11)] =
                   *(flow_t *)
                    (&DAT_00106080 +
                    (iVar12 + ((uint)((int)((ulong)((long)iVar12 -
                                                   SUB168(auVar4 * ZEXT816(0x2492492492492493),8))
                                           >> 1) + SUB164(auVar4 * ZEXT816(0x2492492492492493),8))
                              >> 2) * -7) * 4);
            }
            iVar11 = iVar11 + 1;
          } while (iVar18 != iVar11);
          iVar16 = iVar16 + 1;
        } while (iVar16 != iVar18);
        fVar8 = max_flow_single_pair(&local_a8,&local_78,0,iVar5,&local_98);
        greatest_info.assertions = greatest_info.assertions + 1;
        if (fVar8 != local_98.maxflow) {
          greatest_info.fail_file =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/tests/test-maxflow.c"
          ;
          greatest_info.fail_line = 0x25f;
          greatest_info.msg = "max_flow != result.maxflow";
          if ((greatest_info.flags & 4) != 0) goto LAB_00104123;
LAB_00103e18:
          iVar18 = -1;
          goto LAB_00103e1d;
        }
        gVar7 = validate_with_slow_max_flow(&local_a8,0,iVar5,&local_98);
        iVar16 = (int32_t)local_80;
        if ((gVar7 != GREATEST_TEST_RES_PASS) ||
           (gVar7 = validate_with_slow_max_flow(&local_a8,0,iVar5,&local_98),
           gVar7 != GREATEST_TEST_RES_PASS)) goto LAB_00103e18;
        max_flow_result_destroy(&local_98);
        max_flow_destroy(&local_78);
        flow_network_destroy(&local_a8);
        iVar16 = iVar16 + 1;
      } while (iVar16 != 0x800);
      iVar18 = iVar18 + 1;
    } while (iVar18 != 0xb);
    greatest_info.msg = (char *)0x0;
    iVar18 = 0;
LAB_00103e1d:
    greatest_test_post(iVar18);
  }
  GREATEST_PRINT_REPORT();
  return (int)(greatest_info.failed != 0);
}

Assistant:

int main(int argc, char **argv) {
    GREATEST_MAIN_BEGIN(); /* command-line arguments, initialization. */

    /* If tests are run outside of a suite, a default suite is used. */
    RUN_TEST(weird_network);
    RUN_TEST(weird_network2);
    RUN_TEST(weird_network3);
    RUN_TEST(CLRS_network);
    RUN_TEST(non_trivial_network1);
    RUN_TEST(non_trivial_network2);
    RUN_TEST(non_trivial_network3);
    RUN_TEST(no_path_flow);
    RUN_TEST(single_path_flow);
    RUN_TEST(two_path_flow);
    RUN_TEST(random_networks);

    GREATEST_MAIN_END(); /* display results */
}